

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Postprocess.cpp
# Opt level: O3

size_t __thiscall
Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create
          (AMFImporter *this,string *pID_R,string *pID_G,string *pID_B,string *pID_A)

{
  pointer pcVar1;
  long lVar2;
  long lVar3;
  pointer puVar4;
  string *pID;
  AMFImporter *pAVar5;
  _List_node_base *__n;
  bool bVar6;
  int iVar7;
  size_t idx_target;
  long *plVar8;
  runtime_error *prVar9;
  pointer puVar10;
  _Node *p_Var11;
  size_t *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  ulong *puVar14;
  ulong uVar15;
  _List_node_base *p_Var16;
  pointer puVar17;
  pointer puVar18;
  ulong uVar19;
  CAMFImporter_NodeElement_Texture *pCVar20;
  pointer puVar21;
  size_t sVar22;
  CAMFImporter_NodeElement_Texture *pCVar23;
  _Alloc_hider __s2;
  pointer puVar24;
  CAMFImporter_NodeElement *t_tex;
  vector<CAMFImporter_NodeElement_Texture_*,_std::allocator<CAMFImporter_NodeElement_Texture_*>_>
  src_texture_4check;
  SPP_Texture converted_texture;
  string TextureConverted_ID;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  CAMFImporter_NodeElement_Texture *local_198;
  long local_190;
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string *local_150;
  string *local_148;
  string *local_140;
  SPP_Texture local_138;
  CAMFImporter_NodeElement_Texture *local_e8;
  CAMFImporter_NodeElement_Texture *local_e0;
  size_type local_d8;
  CAMFImporter_NodeElement_Texture *local_d0;
  AMFImporter *local_c8;
  _List_node_base *local_c0;
  CAMFImporter_NodeElement_Texture *local_b8;
  long local_b0;
  _func_int **local_a8;
  long lStack_a0;
  _Alloc_hider local_98;
  _List_node_base *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  CAMFImporter_NodeElement *local_78 [2];
  _List_node_base *local_68;
  size_t *local_58;
  size_t local_50;
  size_t local_48;
  pointer puStack_40;
  pointer local_38;
  
  local_98._M_p = (pointer)&local_88;
  local_90 = (_List_node_base *)0x0;
  local_88._M_local_buf[0] = '\0';
  local_140 = pID_G;
  if ((((pID_R->_M_string_length == 0) && (pID_G->_M_string_length == 0)) &&
      (pID_B->_M_string_length == 0)) && (pID_A->_M_string_length == 0)) {
    prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_138.ID._M_dataplus._M_p = (pointer)&local_138.ID.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,
               "PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.",
               "");
    std::runtime_error::runtime_error(prVar9,(string *)&local_138);
    *(undefined ***)prVar9 = &PTR__runtime_error_0080bf48;
    __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = (pID_R->_M_dataplus)._M_p;
  local_78[0] = (CAMFImporter_NodeElement *)&local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_78,pcVar1,pcVar1 + pID_R->_M_string_length);
  std::__cxx11::string::append((char *)local_78);
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_78,(ulong)(local_140->_M_dataplus)._M_p);
  local_58 = &local_48;
  psVar12 = (size_t *)(plVar8 + 2);
  if ((size_t *)*plVar8 == psVar12) {
    local_48 = *psVar12;
    puStack_40 = (pointer)plVar8[3];
  }
  else {
    local_48 = *psVar12;
    local_58 = (size_t *)*plVar8;
  }
  local_50 = plVar8[1];
  *plVar8 = (long)psVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_c8 = this;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_58);
  pCVar23 = (CAMFImporter_NodeElement_Texture *)(plVar8 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar8 == pCVar23) {
    local_a8 = (pCVar23->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    lStack_a0 = plVar8[3];
    local_b8 = (CAMFImporter_NodeElement_Texture *)&local_a8;
  }
  else {
    local_a8 = (pCVar23->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_b8 = (CAMFImporter_NodeElement_Texture *)*plVar8;
  }
  local_b0 = plVar8[1];
  *plVar8 = (long)pCVar23;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_150 = pID_B;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_b8,(ulong)(pID_B->_M_dataplus)._M_p);
  paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 == paVar13) {
    local_168._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_168._8_8_ = plVar8[3];
    local_178._M_p = (pointer)&local_168;
  }
  else {
    local_168._M_allocated_capacity = paVar13->_M_allocated_capacity;
    local_178._M_p = (pointer)*plVar8;
  }
  paStack_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar8[1];
  *plVar8 = (long)paVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_198 = (CAMFImporter_NodeElement_Texture *)local_188;
  pCVar23 = (CAMFImporter_NodeElement_Texture *)(plVar8 + 2);
  if ((CAMFImporter_NodeElement_Texture *)*plVar8 == pCVar23) {
    local_188._0_8_ = (pCVar23->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_188._8_8_ = plVar8[3];
  }
  else {
    local_188._0_8_ = (pCVar23->super_CAMFImporter_NodeElement)._vptr_CAMFImporter_NodeElement;
    local_198 = (CAMFImporter_NodeElement_Texture *)*plVar8;
  }
  local_190 = plVar8[1];
  *plVar8 = (long)pCVar23;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_148 = pID_A;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_198,(ulong)(pID_A->_M_dataplus)._M_p);
  paVar13 = &local_138.ID.field_2;
  puVar14 = (ulong *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_138.ID.field_2._M_allocated_capacity = *puVar14;
    local_138.ID.field_2._8_8_ = plVar8[3];
    local_138.ID._M_dataplus._M_p = (pointer)paVar13;
  }
  else {
    local_138.ID.field_2._M_allocated_capacity = *puVar14;
    local_138.ID._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_138.ID._M_string_length = plVar8[1];
  *plVar8 = (long)puVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_98,(string *)&local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.ID._M_dataplus._M_p != paVar13) {
    operator_delete(local_138.ID._M_dataplus._M_p,local_138.ID.field_2._M_allocated_capacity + 1);
  }
  if (local_198 != (CAMFImporter_NodeElement_Texture *)local_188) {
    operator_delete(local_198,local_188._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p != &local_168) {
    operator_delete(local_178._M_p,local_168._M_allocated_capacity + 1);
  }
  if (local_b8 != (CAMFImporter_NodeElement_Texture *)&local_a8) {
    operator_delete(local_b8,(long)local_a8 + 1);
  }
  pAVar5 = local_c8;
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_78[0] != (CAMFImporter_NodeElement *)&local_68) {
    operator_delete(local_78[0],(ulong)((long)&local_68->_M_next + 1));
  }
  __n = local_90;
  __s2._M_p = local_98._M_p;
  local_c0 = (_List_node_base *)&pAVar5->mTexture_Converted;
  p_Var16 = (pAVar5->mTexture_Converted).
            super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var16 == local_c0) {
    sVar22 = 0;
  }
  else {
    sVar22 = 0;
    do {
      if ((p_Var16[1]._M_prev == __n) &&
         ((__n == (_List_node_base *)0x0 ||
          (iVar7 = bcmp(p_Var16[1]._M_next,__s2._M_p,(size_t)__n), iVar7 == 0)))) goto LAB_003e5616;
      sVar22 = sVar22 + 1;
      p_Var16 = p_Var16->_M_next;
    } while (p_Var16 != local_c0);
  }
  pID = local_140;
  local_178._M_p = (pointer)0x0;
  paStack_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  pCVar23 = (CAMFImporter_NodeElement_Texture *)0x0;
  local_168._M_allocated_capacity = 0;
  local_138.ID._M_dataplus._M_p = (pointer)&local_138.ID.field_2;
  local_138.ID._M_string_length = 0;
  local_138.ID.field_2._M_allocated_capacity =
       local_138.ID.field_2._M_allocated_capacity & 0xffffffffffffff00;
  if (pID_R->_M_string_length != 0) {
    bVar6 = Find_NodeElement(pAVar5,pID_R,ENET_Texture,(CAMFImporter_NodeElement **)&local_198);
    if (!bVar6) {
      Throw_ID_NotFound(pAVar5,pID_R);
    }
    pCVar23 = local_198;
    local_b8 = local_198;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&local_178,&local_b8);
  }
  if (pID->_M_string_length == 0) {
    local_e0 = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  else {
    bVar6 = Find_NodeElement(pAVar5,pID,ENET_Texture,(CAMFImporter_NodeElement **)&local_198);
    if (!bVar6) {
      Throw_ID_NotFound(pAVar5,pID);
    }
    local_e0 = local_198;
    local_b8 = local_198;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&local_178,&local_b8);
  }
  if (local_150->_M_string_length == 0) {
    local_e8 = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  else {
    bVar6 = Find_NodeElement(pAVar5,local_150,ENET_Texture,(CAMFImporter_NodeElement **)&local_198);
    if (!bVar6) {
      Throw_ID_NotFound(pAVar5,local_150);
    }
    local_e8 = local_198;
    local_b8 = local_198;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&local_178,&local_b8);
  }
  if (local_148->_M_string_length == 0) {
    pCVar20 = (CAMFImporter_NodeElement_Texture *)0x0;
  }
  else {
    bVar6 = Find_NodeElement(pAVar5,local_148,ENET_Texture,(CAMFImporter_NodeElement **)&local_198);
    if (!bVar6) {
      Throw_ID_NotFound(pAVar5,local_148);
    }
    pCVar20 = local_198;
    local_b8 = local_198;
    std::vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
    ::emplace_back<CAMFImporter_NodeElement_Texture*>
              ((vector<CAMFImporter_NodeElement_Texture*,std::allocator<CAMFImporter_NodeElement_Texture*>>
                *)&local_178,&local_b8);
  }
  uVar15 = (long)paStack_170 - (long)local_178._M_p >> 3;
  if (1 < uVar15) {
    uVar19 = 1;
    while (uVar15 != uVar19) {
      lVar2 = *(long *)(local_178._M_p + (uVar19 - 1) * 8);
      lVar3 = *(long *)(local_178._M_p + uVar19 * 8);
      if (((*(long *)(lVar2 + 0x50) != *(long *)(lVar3 + 0x50)) ||
          (*(long *)(lVar2 + 0x58) != *(long *)(lVar3 + 0x58))) ||
         (uVar19 = uVar19 + 1, *(long *)(lVar2 + 0x60) != *(long *)(lVar3 + 0x60))) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_198 = (CAMFImporter_NodeElement_Texture *)local_188;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_198,
                   "PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size."
                   ,"");
        std::runtime_error::runtime_error(prVar9,(string *)&local_198);
        *(undefined ***)prVar9 = &PTR__runtime_error_0080bf48;
        __cxa_throw(prVar9,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
      }
    }
  }
  local_138.Width = *(undefined8 *)(*(size_type *)local_178._M_p + 0x50);
  local_138.Height = *(undefined8 *)(*(size_type *)local_178._M_p + 0x58);
  local_138.Depth = *(size_t *)(*(size_type *)local_178._M_p + 0x60);
  local_138.Tiled = false;
  if (paStack_170 !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p) {
    uVar19 = 0;
    local_138.Tiled = false;
    do {
      local_138.Tiled =
           (bool)(local_138.Tiled | *(byte *)(*(long *)(local_178._M_p + uVar19 * 8) + 0x80));
      uVar19 = uVar19 + 1;
    } while ((uVar19 & 0xff) < uVar15);
  }
  builtin_strncpy(local_138.FormatHint,"rgba0000",9);
  local_38 = (pointer)pID_R->_M_string_length;
  if (local_38 != (pointer)0x0) {
    builtin_strncpy(local_138.FormatHint,"rgba8000",8);
  }
  local_d8 = pID->_M_string_length;
  if (local_d8 != 0) {
    local_138.FormatHint[5] = '8';
  }
  if (local_150->_M_string_length != 0) {
    local_138.FormatHint[6] = '8';
  }
  if (local_148->_M_string_length != 0) {
    local_138.FormatHint[7] = '8';
  }
  bVar6 = pCVar23 != (CAMFImporter_NodeElement_Texture *)0x0 && local_38 != (pointer)0x0;
  if (bVar6) {
    puVar18 = (pCVar23->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              -(long)(pCVar23->Data).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
  }
  else {
    puVar18 = (pointer)0x0;
  }
  puVar24 = (pointer)(ulong)bVar6;
  puVar21 = puVar24;
  if (local_e0 != (CAMFImporter_NodeElement_Texture *)0x0 && local_d8 != 0) {
    puVar18 = (local_e0->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              ((long)puVar18 -
              (long)(local_e0->Data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    puVar21 = puVar24 + 1;
  }
  puVar17 = puVar21;
  if (local_e8 != (CAMFImporter_NodeElement_Texture *)0x0 && local_150->_M_string_length != 0) {
    puVar18 = (local_e8->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              ((long)puVar18 -
              (long)(local_e8->Data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    puVar17 = puVar21 + 1;
  }
  if (pCVar20 != (CAMFImporter_NodeElement_Texture *)0x0 && local_148->_M_string_length != 0) {
    puVar18 = (pCVar20->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish +
              ((long)puVar18 -
              (long)(pCVar20->Data).
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
    puVar17 = puVar17 + 1;
  }
  local_d0 = pCVar20;
  local_138.Data = (uint8_t *)operator_new__((ulong)puVar18);
  pAVar5 = local_c8;
  if ((local_38 != (pointer)0x0) && (puVar18 != (pointer)0x0)) {
    if (pCVar23 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003e565e;
    puVar10 = (pointer)0x0;
    uVar15 = 0;
    do {
      puVar4 = (pCVar23->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pCVar23->Data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar4) <= uVar15)
      goto LAB_003e564b;
      local_138.Data[(long)puVar10] = puVar4[uVar15];
      puVar10 = puVar10 + (long)puVar17;
      uVar15 = uVar15 + 1;
    } while (puVar10 < puVar18);
    local_d8 = local_140->_M_string_length;
  }
  if ((puVar24 < puVar18) && (local_d8 != 0)) {
    if (local_e0 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003e565e;
    uVar15 = 0;
    do {
      puVar10 = (local_e0->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_e0->Data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar10) <= uVar15)
      goto LAB_003e564b;
      local_138.Data[(long)puVar24] = puVar10[uVar15];
      puVar24 = puVar24 + (long)puVar17;
      uVar15 = uVar15 + 1;
    } while (puVar24 < puVar18);
  }
  if ((local_150->_M_string_length != 0) && (puVar21 < puVar18)) {
    if (local_e8 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003e565e;
    uVar15 = 0;
    do {
      puVar24 = (local_e8->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_e8->Data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar24) <= uVar15)
      goto LAB_003e564b;
      local_138.Data[(long)puVar21] = puVar24[uVar15];
      puVar21 = puVar21 + (long)puVar17;
      uVar15 = uVar15 + 1;
    } while (puVar21 < puVar18);
  }
  if ((local_148->_M_string_length != 0) && (puVar21 = puVar17 + -1, puVar21 < puVar18)) {
    if (local_d0 == (CAMFImporter_NodeElement_Texture *)0x0) goto LAB_003e565e;
    uVar15 = 0;
    do {
      puVar24 = (local_d0->Data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(local_d0->Data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar24) <= uVar15)
      goto LAB_003e564b;
      local_138.Data[(long)puVar21] = puVar24[uVar15];
      puVar21 = puVar21 + (long)puVar17;
      uVar15 = uVar15 + 1;
    } while (puVar21 < puVar18);
  }
  std::__cxx11::string::_M_assign((string *)&local_138);
  p_Var11 = std::__cxx11::
            list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
            ::_M_create_node<Assimp::AMFImporter::SPP_Texture_const&>
                      ((list<Assimp::AMFImporter::SPP_Texture,std::allocator<Assimp::AMFImporter::SPP_Texture>>
                        *)local_c0,&local_138);
  std::__detail::_List_node_base::_M_hook(&p_Var11->super__List_node_base);
  psVar12 = &(pAVar5->mTexture_Converted).
             super__List_base<Assimp::AMFImporter::SPP_Texture,_std::allocator<Assimp::AMFImporter::SPP_Texture>_>
             ._M_impl._M_node._M_size;
  *psVar12 = *psVar12 + 1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138.ID._M_dataplus._M_p != &local_138.ID.field_2) {
    operator_delete(local_138.ID._M_dataplus._M_p,local_138.ID.field_2._M_allocated_capacity + 1);
  }
  __s2._M_p = local_98._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_178._M_p,local_168._M_allocated_capacity - (long)local_178._M_p);
    __s2._M_p = local_98._M_p;
  }
LAB_003e5616:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__s2._M_p != &local_88) {
    operator_delete(__s2._M_p,
                    CONCAT71(local_88._M_allocated_capacity._1_7_,local_88._M_local_buf[0]) + 1);
  }
  return sVar22;
LAB_003e564b:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_003e565e:
  __assert_fail("tex",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/AMF/AMFImporter_Postprocess.cpp"
                ,0x120,
                "auto Assimp::AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string &, const std::string &, const std::string &, const std::string &)::(anonymous class)::operator()(const std::string &, const size_t, const size_t, const uint8_t) const"
               );
}

Assistant:

size_t AMFImporter::PostprocessHelper_GetTextureID_Or_Create(const std::string& pID_R, const std::string& pID_G, const std::string& pID_B,
																const std::string& pID_A)
{
    size_t TextureConverted_Index;
    std::string TextureConverted_ID;

	// check input data
	if(pID_R.empty() && pID_G.empty() && pID_B.empty() && pID_A.empty())
		throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. At least one texture ID must be defined.");

	// Create ID
	TextureConverted_ID = pID_R + "_" + pID_G + "_" + pID_B + "_" + pID_A;
	// Check if texture specified by set of IDs is converted already.
	TextureConverted_Index = 0;
	for(const SPP_Texture& tex_convd: mTexture_Converted)
	{
        if ( tex_convd.ID == TextureConverted_ID ) {
            return TextureConverted_Index;
        } else {
            ++TextureConverted_Index;
        }
	}

	//
	// Converted texture not found, create it.
	//
	CAMFImporter_NodeElement_Texture* src_texture[4]{nullptr};
	std::vector<CAMFImporter_NodeElement_Texture*> src_texture_4check;
	SPP_Texture converted_texture;

	{// find all specified source textures
		CAMFImporter_NodeElement* t_tex;

		// R
		if(!pID_R.empty())
		{
			if(!Find_NodeElement(pID_R, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_R);

			src_texture[0] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[0] = nullptr;
		}

		// G
		if(!pID_G.empty())
		{
			if(!Find_NodeElement(pID_G, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_G);

			src_texture[1] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[1] = nullptr;
		}

		// B
		if(!pID_B.empty())
		{
			if(!Find_NodeElement(pID_B, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_B);

			src_texture[2] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[2] = nullptr;
		}

		// A
		if(!pID_A.empty())
		{
			if(!Find_NodeElement(pID_A, CAMFImporter_NodeElement::ENET_Texture, &t_tex)) Throw_ID_NotFound(pID_A);

			src_texture[3] = (CAMFImporter_NodeElement_Texture*)t_tex;
			src_texture_4check.push_back((CAMFImporter_NodeElement_Texture*)t_tex);
		}
		else
		{
			src_texture[3] = nullptr;
		}
	}// END: find all specified source textures

	// check that all textures has same size
	if(src_texture_4check.size() > 1)
	{
		for (size_t i = 0, i_e = (src_texture_4check.size() - 1); i < i_e; i++)
		{
			if((src_texture_4check[i]->Width != src_texture_4check[i + 1]->Width) || (src_texture_4check[i]->Height != src_texture_4check[i + 1]->Height) ||
				(src_texture_4check[i]->Depth != src_texture_4check[i + 1]->Depth))
			{
				throw DeadlyImportError("PostprocessHelper_GetTextureID_Or_Create. Source texture must has the same size.");
			}
		}
	}// if(src_texture_4check.size() > 1)

	// set texture attributes
	converted_texture.Width = src_texture_4check[0]->Width;
	converted_texture.Height = src_texture_4check[0]->Height;
	converted_texture.Depth = src_texture_4check[0]->Depth;
	// if one of source texture is tiled then converted texture is tiled too.
	converted_texture.Tiled = false;
	for(uint8_t i = 0; i < src_texture_4check.size(); i++) converted_texture.Tiled |= src_texture_4check[i]->Tiled;

	// Create format hint.
	strcpy(converted_texture.FormatHint, "rgba0000");// copy initial string.
	if(!pID_R.empty()) converted_texture.FormatHint[4] = '8';
	if(!pID_G.empty()) converted_texture.FormatHint[5] = '8';
	if(!pID_B.empty()) converted_texture.FormatHint[6] = '8';
	if(!pID_A.empty()) converted_texture.FormatHint[7] = '8';

	//
	// Сopy data of textures.
	//
	size_t tex_size = 0;
	size_t step = 0;
	size_t off_g = 0;
	size_t off_b = 0;

	// Calculate size of the target array and rule how data will be copied.
    if(!pID_R.empty() && nullptr != src_texture[ 0 ] ) {
        tex_size += src_texture[0]->Data.size(); step++, off_g++, off_b++;
    }
    if(!pID_G.empty() && nullptr != src_texture[ 1 ] ) {
        tex_size += src_texture[1]->Data.size(); step++, off_b++;
    }
    if(!pID_B.empty() && nullptr != src_texture[ 2 ] ) {
        tex_size += src_texture[2]->Data.size(); step++;
    }
    if(!pID_A.empty() && nullptr != src_texture[ 3 ] ) {
        tex_size += src_texture[3]->Data.size(); step++;
    }

    // Create target array.
	converted_texture.Data = new uint8_t[tex_size];
	// And copy data
	auto CopyTextureData = [&](const std::string& pID, const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void
	{
		if(!pID.empty())
		{
			for(size_t idx_target = pOffset, idx_src = 0; idx_target < tex_size; idx_target += pStep, idx_src++) {
				CAMFImporter_NodeElement_Texture* tex = src_texture[pSrcTexNum];
				ai_assert(tex);
				converted_texture.Data[idx_target] = tex->Data.at(idx_src);
			}
		}
	};// auto CopyTextureData = [&](const size_t pOffset, const size_t pStep, const uint8_t pSrcTexNum) -> void

	CopyTextureData(pID_R, 0, step, 0);
	CopyTextureData(pID_G, off_g, step, 1);
	CopyTextureData(pID_B, off_b, step, 2);
	CopyTextureData(pID_A, step - 1, step, 3);

	// Store new converted texture ID
	converted_texture.ID = TextureConverted_ID;
	// Store new converted texture
	mTexture_Converted.push_back(converted_texture);

	return TextureConverted_Index;
}